

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_layout_mapping_right_basics.cpp
# Opt level: O0

void test_2d_static<30ul,1ul>(void)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  value_type vVar4;
  size_type sVar5;
  __tuple_element_t<0UL,_tuple<int,_int>_> *p_Var6;
  __tuple_element_t<1UL,_tuple<int,_int>_> *p_Var7;
  tuple<int,_int> *local_178;
  tuple<int,_int> *local_170;
  tuple<int,_int> *local_168;
  size_type local_160;
  unsigned_long local_158;
  value_type true_idx;
  int i;
  int j;
  tuple<int,_int> dptr [30];
  unsigned_long local_50;
  size_type local_48;
  unsigned_long local_40;
  size_type local_38;
  int local_2c;
  size_type local_28;
  int local_1c;
  size_type local_18;
  bool local_d;
  bool local_c;
  layout_mapping_right<std::experimental::dimensions<30UL,_1UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<0UL,_0UL>_>
  local_b [2];
  layout_mapping_right<std::experimental::dimensions<30UL,_1UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<0UL,_0UL>_>
  l;
  
  std::experimental::
  layout_mapping_right<std::experimental::dimensions<30UL,_1UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<0UL,_0UL>_>
  ::layout_mapping_right(local_b);
  local_c = std::experimental::
            layout_mapping_right<std::experimental::dimensions<30UL,_1UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<0UL,_0UL>_>
            ::is_regular();
  local_d = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_regular())","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
             ,0x5b,"void test_2d_static() [X = 30UL, Y = 1UL]",&local_c,&local_d);
  local_18 = std::experimental::
             layout_mapping_right<std::experimental::dimensions<30UL,_1UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<0UL,_0UL>_>
             ::stride(local_b,0);
  local_1c = 1;
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(0))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
             ,0x5d,"void test_2d_static() [X = 30UL, Y = 1UL]",&local_18,&local_1c);
  local_28 = std::experimental::
             layout_mapping_right<std::experimental::dimensions<30UL,_1UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<0UL,_0UL>_>
             ::stride(local_b,1);
  local_2c = 1;
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(1))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
             ,0x5e,"void test_2d_static() [X = 30UL, Y = 1UL]",&local_28,&local_2c);
  local_38 = std::experimental::dimensions<30UL,_1UL>::size((dimensions<30UL,_1UL> *)local_b);
  local_40 = 0x1e;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.size())","X * Y",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
             ,0x60,"void test_2d_static() [X = 30UL, Y = 1UL]",&local_38,&local_40);
  local_48 = std::experimental::
             layout_mapping_right<std::experimental::dimensions<30UL,_1UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<0UL,_0UL>_>
             ::span(local_b);
  local_50 = 0x1e;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.span())","X * Y",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
             ,0x61,"void test_2d_static() [X = 30UL, Y = 1UL]",&local_48,&local_50);
  local_178 = (tuple<int,_int> *)&i;
  do {
    std::tuple<int,_int>::tuple<true,_true>(local_178);
    local_178 = local_178 + 1;
  } while (local_178 != dptr + 0x1d);
  true_idx._4_4_ = 0;
  while( true ) {
    uVar3 = (ulong)true_idx._4_4_;
    vVar4 = std::experimental::dimensions<30UL,_1UL>::operator[]<int>
                      ((dimensions<30UL,_1UL> *)local_b,1);
    if (vVar4 <= uVar3) break;
    true_idx._0_4_ = 0;
    while( true ) {
      uVar3 = (ulong)(int)true_idx;
      vVar4 = std::experimental::dimensions<30UL,_1UL>::operator[]<int>
                        ((dimensions<30UL,_1UL> *)local_b,0);
      if (vVar4 <= uVar3) break;
      vVar4 = std::experimental::dimensions<30UL,_1UL>::operator[]<int>
                        ((dimensions<30UL,_1UL> *)local_b,1);
      local_158 = vVar4 * (long)(int)true_idx + (long)true_idx._4_4_;
      local_160 = std::experimental::
                  layout_mapping_right<std::experimental::dimensions<30ul,1ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,0ul>>
                  ::index<int,int>((layout_mapping_right<std::experimental::dimensions<30ul,1ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,0ul>>
                                    *)local_b,(int)true_idx,true_idx._4_4_);
      boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                ("(l.index(i, j))","true_idx",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
                 ,0x6b,"void test_2d_static() [X = 30UL, Y = 1UL]",&local_160,&local_158);
      sVar5 = std::experimental::
              layout_mapping_right<std::experimental::dimensions<30ul,1ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,0ul>>
              ::index<int,int>((layout_mapping_right<std::experimental::dimensions<30ul,1ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,0ul>>
                                *)local_b,(int)true_idx,true_idx._4_4_);
      local_168 = (tuple<int,_int> *)(&i + sVar5 * 2);
      local_170 = (tuple<int,_int> *)(&i + local_158 * 2);
      boost::detail::test_eq_impl<std::tuple<int,int>*,std::tuple<int,int>*>
                ("&(dptr[l.index(i, j)])","&(dptr[true_idx])",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
                 ,0x6d,"void test_2d_static() [X = 30UL, Y = 1UL]",&local_168,&local_170);
      iVar1 = (int)true_idx;
      sVar5 = std::experimental::
              layout_mapping_right<std::experimental::dimensions<30ul,1ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,0ul>>
              ::index<int,int>((layout_mapping_right<std::experimental::dimensions<30ul,1ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,0ul>>
                                *)local_b,(int)true_idx,true_idx._4_4_);
      p_Var6 = std::get<0ul,int,int>((tuple<int,_int> *)(&i + sVar5 * 2));
      iVar2 = true_idx._4_4_;
      *p_Var6 = iVar1;
      sVar5 = std::experimental::
              layout_mapping_right<std::experimental::dimensions<30ul,1ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,0ul>>
              ::index<int,int>((layout_mapping_right<std::experimental::dimensions<30ul,1ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,0ul>>
                                *)local_b,(int)true_idx,true_idx._4_4_);
      p_Var7 = std::get<1ul,int,int>((tuple<int,_int> *)(&i + sVar5 * 2));
      *p_Var7 = iVar2;
      sVar5 = std::experimental::
              layout_mapping_right<std::experimental::dimensions<30ul,1ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,0ul>>
              ::index<int,int>((layout_mapping_right<std::experimental::dimensions<30ul,1ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,0ul>>
                                *)local_b,(int)true_idx,true_idx._4_4_);
      p_Var6 = std::get<0ul,int,int>((tuple<int,_int> *)(&i + sVar5 * 2));
      boost::detail::test_eq_impl<int,int>
                ("(std::get<0>(dptr[l.index(i, j)]))","i",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
                 ,0x72,"void test_2d_static() [X = 30UL, Y = 1UL]",p_Var6,(int *)&true_idx);
      sVar5 = std::experimental::
              layout_mapping_right<std::experimental::dimensions<30ul,1ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,0ul>>
              ::index<int,int>((layout_mapping_right<std::experimental::dimensions<30ul,1ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,0ul>>
                                *)local_b,(int)true_idx,true_idx._4_4_);
      p_Var7 = std::get<1ul,int,int>((tuple<int,_int> *)(&i + sVar5 * 2));
      boost::detail::test_eq_impl<int,int>
                ("(std::get<1>(dptr[l.index(i, j)]))","j",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
                 ,0x73,"void test_2d_static() [X = 30UL, Y = 1UL]",p_Var7,
                 (int *)((long)&true_idx + 4));
      true_idx._0_4_ = (int)true_idx + 1;
    }
    true_idx._4_4_ = true_idx._4_4_ + 1;
  }
  return;
}

Assistant:

void test_2d_static()
{ // {{{
    layout_mapping_right<
        dimensions<X, Y>, dimensions<1, 1>, dimensions<0, 0>
    > const l{};

    BOOST_TEST_EQ((l.is_regular()), true);

    BOOST_TEST_EQ((l.stride(0)), 1);
    BOOST_TEST_EQ((l.stride(1)), 1);

    BOOST_TEST_EQ((l.size()), X * Y);
    BOOST_TEST_EQ((l.span()), X * Y);

    tuple<int, int> dptr[X * Y];

    // Set all elements to a unique value.
    for (auto j = 0; j < l[1]; ++j)
    for (auto i = 0; i < l[0]; ++i)
    {
        auto const true_idx = (l[1]) * (i) + (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[l.index(i, j)]), &(dptr[true_idx])); 

        std::get<0>(dptr[l.index(i, j)]) = i;
        std::get<1>(dptr[l.index(i, j)]) = j;

        BOOST_TEST_EQ((std::get<0>(dptr[l.index(i, j)])), i); 
        BOOST_TEST_EQ((std::get<1>(dptr[l.index(i, j)])), j); 
    }
}